

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
clipp::usage_lines::group_surrounders_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,usage_lines *this,group *group,context *cur)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  group *pgVar2;
  child_t<clipp::parameter,_clipp::group> *pcVar3;
  pointer this_00;
  bool bVar4;
  char cVar5;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  _Var6;
  string prefix;
  string postfix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  uint7 uStack_3f;
  undefined8 uStack_38;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pgVar2 = cur->outermost;
  if ((pgVar2 == group) && (this->ommitOutermostSurrounders_ == true)) {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) =
         CONCAT17(local_70.field_2._M_local_buf[8],local_70.field_2._M_allocated_capacity._1_7_);
    *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_70.field_2._9_4_;
    *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_70.field_2._13_2_;
    (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_70.field_2._M_local_buf[0xf];
    (__return_storage_ptr__->first)._M_string_length = 0;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = (ulong)uStack_3f << 8;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_38;
    (__return_storage_ptr__->second)._M_string_length = 0;
    return __return_storage_ptr__;
  }
  if (group->exclusive_ == true) {
    pcVar3 = (group->children_).
             super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_pred<clipp::group::any_required()const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                      ((group->children_).
                       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,pcVar3);
    if (_Var6._M_current == pcVar3) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
      std::__cxx11::string::_M_assign((string *)&local_90);
      pcVar3 = (group->children_).
               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_negate<clipp::group::all_flagless()const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                        ((group->children_).
                         super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,pcVar3);
      if (_Var6._M_current == pcVar3) {
        std::__cxx11::string::_M_append
                  ((char *)&local_b0,(ulong)(this->fmt_).labelPre_._M_dataplus._M_p);
        std::operator+(&local_70,&(this->fmt_).labelPre_,&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_001153b5;
    }
    pcVar3 = (group->children_).
             super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_negate<clipp::group::all_flagless()const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                      ((group->children_).
                       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,pcVar3);
    if (_Var6._M_current == pcVar3) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    else {
      bVar4 = context::is_singleton(cur);
      if (pgVar2 == group && bVar4) goto LAB_001153b5;
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
  }
  else {
    this_00 = (group->children_).
              super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(group->children_).
                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3) *
                   0xf83e0f83e0f83e1)) {
      if (this_00->type_ == group) {
        cVar5 = clipp::group::blocking((group *)this_00);
      }
      else {
        if (this_00->type_ != param) goto LAB_00115314;
        cVar5 = *(bool *)((long)&this_00->m_ + 0x21);
      }
      if ((cVar5 != '\0') &&
         (bVar4 = clipp::group::child_t<clipp::parameter,_clipp::group>::required
                            ((group->children_).
                             super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                             ._M_impl.super__Vector_impl_data._M_start), !bVar4)) {
        std::__cxx11::string::_M_assign((string *)&local_b0);
        goto LAB_001153a5;
      }
    }
LAB_00115314:
    if ((((ulong)(((long)(group->children_).
                         super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(group->children_).
                         super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1) < 2)
        || (((cur->pos).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].parent)->exclusive_ != true)) ||
       (cur->outermost == group)) {
      if (((group->exclusive_ != false) || (group->joinable_ != true)) || (cur->linestart != false))
      goto LAB_001153b5;
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
  }
LAB_001153a5:
  std::__cxx11::string::_M_assign((string *)&local_90);
LAB_001153b5:
  if ((group->super_token<clipp::group>).repeatable_ == true) {
    if (local_b0._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    std::operator+(&local_70,&(this->fmt_).repeatPre_,&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_90._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    std::__cxx11::string::_M_append
              ((char *)&local_90,(ulong)(this->fmt_).repeatPst_._M_dataplus._M_p);
  }
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,local_b0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_b0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,local_b0.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->first)._M_string_length = local_b0._M_string_length;
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_90.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = local_90._M_dataplus._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->second)._M_string_length = local_90._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::pair<string,string>
    group_surrounders(const group& group, const context& cur) const
    {
        string prefix;
        string postfix;

        const bool isOutermost = &group == cur.outermost;
        if(isOutermost && ommitOutermostSurrounders_)
            return {string{}, string{}};

        if(group.exclusive()) {
            if(group.all_optional()) {
                prefix  = fmt_.optional_prefix();
                postfix = fmt_.optional_postfix();
                if(group.all_flagless()) {
                    prefix  += fmt_.label_prefix();
                    postfix = fmt_.label_prefix() + postfix;
                }
            } else if(group.all_flagless()) {
                prefix  = fmt_.label_prefix();
                postfix = fmt_.label_postfix();
            } else if(!cur.is_singleton() || !isOutermost) {
                prefix  = fmt_.alternatives_prefix();
                postfix = fmt_.alternatives_postfix();
            }
        }
        else if(group.size() > 1 &&
                group.front().blocking() && !group.front().required())
        {
            prefix  = fmt_.optional_prefix();
            postfix = fmt_.optional_postfix();
        }
        else if(group.size() > 1 && cur.is_alternative() &&
                &group != cur.outermost)
        {
            prefix  = fmt_.group_prefix();
            postfix = fmt_.group_postfix();
        }
        else if(!group.exclusive() &&
            group.joinable() && !cur.linestart)
        {
            prefix  = fmt_.joinable_prefix();
            postfix = fmt_.joinable_postfix();
        }

        if(group.repeatable()) {
            if(prefix.empty()) prefix = fmt_.group_prefix();
            prefix = fmt_.repeat_prefix() + prefix;
            if(postfix.empty()) postfix = fmt_.group_postfix();
            postfix += fmt_.repeat_postfix();
        }

        return {std::move(prefix), std::move(postfix)};
    }